

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_b18c9b::TestPresetOutputVerbosityHelper(VerbosityEnum *out,Value *value)

{
  bool bVar1;
  String local_90;
  String local_70;
  String local_40;
  Value *local_20;
  Value *value_local;
  VerbosityEnum *out_local;
  
  if (value == (Value *)0x0) {
    *out = Default;
    out_local._4_4_ = READ_OK;
  }
  else {
    local_20 = value;
    value_local = (Value *)out;
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_40,local_20);
      bVar1 = std::operator==(&local_40,"default");
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        *(undefined4 *)&value_local->value_ = 0;
        out_local._4_4_ = READ_OK;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_70,local_20);
        bVar1 = std::operator==(&local_70,"verbose");
        std::__cxx11::string::~string((string *)&local_70);
        if (bVar1) {
          *(undefined4 *)&value_local->value_ = 1;
          out_local._4_4_ = READ_OK;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_90,local_20);
          bVar1 = std::operator==(&local_90,"extra");
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar1) {
            *(undefined4 *)&value_local->value_ = 2;
            out_local._4_4_ = READ_OK;
          }
          else {
            out_local._4_4_ = INVALID_PRESET;
          }
        }
      }
    }
    else {
      out_local._4_4_ = INVALID_PRESET;
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult TestPresetOutputVerbosityHelper(
  TestPreset::OutputOptions::VerbosityEnum& out, const Json::Value* value)
{
  if (!value) {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "default") {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "verbose") {
    out = TestPreset::OutputOptions::VerbosityEnum::Verbose;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "extra") {
    out = TestPreset::OutputOptions::VerbosityEnum::Extra;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}